

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallExportGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallExportGenerator::cmInstallExportGenerator
          (cmInstallExportGenerator *this,cmExportSet *exportSet,string *destination,
          string *file_permissions,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configurations,string *component,MessageLevel message,bool exclude_from_all,
          string *filename,string *name_space,string *cxx_modules_directory,bool exportOld,
          bool android,bool exportPackageDependencies,cmListFileBacktrace *backtrace)

{
  byte bVar1;
  string *configurations_00;
  unique_ptr<cmExportInstallFileGenerator,_std::default_delete<cmExportInstallFileGenerator>_>
  local_c8;
  cmInstallExportGenerator *local_c0;
  unique_ptr<cmExportInstallAndroidMKGenerator,_std::default_delete<cmExportInstallAndroidMKGenerator>_>
  local_b8;
  cmListFileBacktrace local_b0 [2];
  string local_90;
  string local_70;
  byte local_4c;
  byte local_4b;
  byte local_4a;
  byte local_49;
  bool exportPackageDependencies_local;
  bool android_local;
  bool exportOld_local;
  string *psStack_48;
  bool exclude_from_all_local;
  string *component_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *configurations_local;
  string *file_permissions_local;
  string *destination_local;
  cmExportSet *exportSet_local;
  cmInstallExportGenerator *this_local;
  
  local_49 = exclude_from_all;
  local_4a = exportOld;
  local_4b = android;
  local_4c = exportPackageDependencies;
  psStack_48 = component;
  component_local = (string *)configurations;
  configurations_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)file_permissions;
  file_permissions_local = destination;
  destination_local = (string *)exportSet;
  exportSet_local = (cmExportSet *)this;
  std::__cxx11::string::string((string *)&local_70,(string *)destination);
  configurations_00 = component_local;
  std::__cxx11::string::string((string *)&local_90,(string *)psStack_48);
  bVar1 = local_49;
  cmListFileBacktrace::cmListFileBacktrace(local_b0,backtrace);
  cmInstallGenerator::cmInstallGenerator
            (&this->super_cmInstallGenerator,&local_70,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)configurations_00,&local_90,message,(bool)(bVar1 & 1),false,local_b0);
  cmListFileBacktrace::~cmListFileBacktrace(local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  (this->super_cmInstallGenerator).super_cmScriptGenerator._vptr_cmScriptGenerator =
       (_func_int **)&PTR__cmInstallExportGenerator_01559750;
  this->ExportSet = (cmExportSet *)destination_local;
  std::__cxx11::string::string((string *)&this->FilePermissions,(string *)file_permissions);
  std::__cxx11::string::string((string *)&this->FileName,(string *)filename);
  std::__cxx11::string::string((string *)&this->Namespace,(string *)name_space);
  std::__cxx11::string::string((string *)&this->CxxModulesDirectory,(string *)cxx_modules_directory)
  ;
  this->ExportOld = (bool)(local_4a & 1);
  this->ExportPackageDependencies = (bool)(local_4c & 1);
  this->LocalGenerator = (cmLocalGenerator *)0x0;
  std::__cxx11::string::string((string *)&this->TempDir);
  std::__cxx11::string::string((string *)&this->MainImportFile);
  std::unique_ptr<cmExportInstallFileGenerator,std::default_delete<cmExportInstallFileGenerator>>::
  unique_ptr<std::default_delete<cmExportInstallFileGenerator>,void>
            ((unique_ptr<cmExportInstallFileGenerator,std::default_delete<cmExportInstallFileGenerator>>
              *)&this->EFGen);
  if ((local_4b & 1) == 0) {
    std::make_unique<cmExportInstallFileGenerator,cmInstallExportGenerator*>
              ((cmInstallExportGenerator **)&local_c8);
    std::
    unique_ptr<cmExportInstallFileGenerator,_std::default_delete<cmExportInstallFileGenerator>_>::
    operator=(&this->EFGen,&local_c8);
    std::
    unique_ptr<cmExportInstallFileGenerator,_std::default_delete<cmExportInstallFileGenerator>_>::
    ~unique_ptr(&local_c8);
  }
  else {
    local_c0 = this;
    std::make_unique<cmExportInstallAndroidMKGenerator,cmInstallExportGenerator*>
              ((cmInstallExportGenerator **)&local_b8);
    std::unique_ptr<cmExportInstallFileGenerator,std::default_delete<cmExportInstallFileGenerator>>
    ::operator=((unique_ptr<cmExportInstallFileGenerator,std::default_delete<cmExportInstallFileGenerator>>
                 *)&this->EFGen,&local_b8);
    std::
    unique_ptr<cmExportInstallAndroidMKGenerator,_std::default_delete<cmExportInstallAndroidMKGenerator>_>
    ::~unique_ptr(&local_b8);
  }
  cmExportSet::AddInstallation((cmExportSet *)destination_local,this);
  return;
}

Assistant:

cmInstallExportGenerator::cmInstallExportGenerator(
  cmExportSet* exportSet, std::string const& destination,
  std::string file_permissions, std::vector<std::string> const& configurations,
  std::string const& component, MessageLevel message, bool exclude_from_all,
  std::string filename, std::string name_space,
  std::string cxx_modules_directory, bool exportOld, bool android,
  bool exportPackageDependencies, cmListFileBacktrace backtrace)
  : cmInstallGenerator(destination, configurations, component, message,
                       exclude_from_all, false, std::move(backtrace))
  , ExportSet(exportSet)
  , FilePermissions(std::move(file_permissions))
  , FileName(std::move(filename))
  , Namespace(std::move(name_space))
  , CxxModulesDirectory(std::move(cxx_modules_directory))
  , ExportOld(exportOld)
  , ExportPackageDependencies(exportPackageDependencies)
{
  if (android) {
#ifndef CMAKE_BOOTSTRAP
    this->EFGen = cm::make_unique<cmExportInstallAndroidMKGenerator>(this);
#endif
  } else {
    this->EFGen = cm::make_unique<cmExportInstallFileGenerator>(this);
  }
  exportSet->AddInstallation(this);
}